

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

Matrix * __thiscall Matrix::differentiate(Matrix *this)

{
  double *pdVar1;
  size_t __n;
  uint uVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  void *__s;
  int iVar8;
  int dim;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  
  iVar4 = this->nMatrixDimension;
  uVar2 = iVar4 - 1;
  __n = (long)(int)uVar2 * 4;
  uVar9 = 0xffffffffffffffff;
  if (0 < iVar4) {
    uVar9 = __n;
  }
  __s = operator_new__(uVar9);
  if (1 < iVar4) {
    memset(__s,0,__n);
  }
  pdVar5 = this->pData;
  piVar6 = this->pSize;
  piVar7 = this->pMult;
  do {
    lVar11 = (long)(iVar4 + -2);
    bVar13 = uVar2 == 0;
    if (iVar4 == 1) {
LAB_00136eed:
      lVar11 = 0;
    }
    else {
      do {
        iVar8 = *(int *)((long)__s + lVar11 * 4) + 1;
        *(int *)((long)__s + lVar11 * 4) = iVar8;
        bVar13 = iVar8 == piVar6[lVar11];
        if (!bVar13) break;
        *(undefined4 *)((long)__s + lVar11 * 4) = 0;
        bVar12 = lVar11 != 0;
        lVar11 = lVar11 + -1;
      } while (bVar12);
      if (iVar4 < 2) goto LAB_00136eed;
      uVar9 = 0;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + piVar7[uVar9] * *(int *)((long)__s + uVar9 * 4);
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
      lVar11 = (long)iVar8;
    }
    lVar10 = (long)piVar6[(int)uVar2];
    if (1 < lVar10) {
      pdVar1 = pdVar5 + lVar11;
      lVar11 = 1;
      dVar14 = *pdVar1;
      do {
        dVar3 = pdVar1[lVar11];
        pdVar1[lVar11] = dVar3 - dVar14;
        lVar11 = lVar11 + 1;
        dVar14 = dVar3;
      } while (lVar10 != lVar11);
    }
    if (bVar13) {
      operator_delete__(__s);
      return this;
    }
  } while( true );
}

Assistant:

Matrix &Matrix::differentiate()
{
	int n = nMatrixDimension-1;
	bool done = false;
	int *indices = new int[n];
	for (int i=0; i<n; ++i)
		indices[i] = 0;
	
	while (!done) {
		
		// increase indices
		if (!n)
			done = true;
		else for (int dim=n-1; dim+1; --dim) {
			indices[dim]++;
			if (indices[dim] == pSize[dim]) {
				indices[dim] = 0;
				if (!dim) 
					done = true;
			} else
				break;
		}
		
		// create offset from indices
		int offset = 0;
		for (int i=0; i<n; ++i)
			offset += indices[i]*pMult[i];
		
		// differentiate last dimension of this offset
		double last = pData[offset];
		for (int i=1; i<pSize[n]; ++i) {
			double next = pData[offset+i] - last;
			last = pData[offset+i];
			pData[offset+i] = next;
		}
	}
	
	delete[] indices;
	return *this;
}